

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::TransactionCanBeAbandoned(CWallet *this,uint256 *hashTx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CWalletTx *wtx_00;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  CWalletTx *wtx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  CWalletTx *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar4;
  undefined8 in_stack_ffffffffffffffb8;
  CWallet *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RSI,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x18,0));
  wtx_00 = GetWalletTx(in_RDI,(uint256 *)
                              CONCAT17(in_stack_ffffffffffffffaf,
                                       CONCAT16(in_stack_ffffffffffffffae,
                                                CONCAT24(in_stack_ffffffffffffffac,
                                                         in_stack_ffffffffffffffa8))));
  bVar4 = 0;
  if (wtx_00 != (CWalletTx *)0x0) {
    bVar2 = CWalletTx::isAbandoned
                      ((CWalletTx *)
                       (ulong)CONCAT16(in_stack_ffffffffffffffae,
                                       CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                                      ));
    bVar4 = 0;
    if (!bVar2) {
      iVar3 = GetTxDepthInMainChain(in_stack_ffffffffffffffc0,wtx_00);
      bVar4 = 0;
      if (iVar3 == 0) {
        bVar2 = CWalletTx::InMempool(in_stack_ffffffffffffff98);
        bVar4 = bVar2 ^ 0xff;
      }
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::TransactionCanBeAbandoned(const uint256& hashTx) const
{
    LOCK(cs_wallet);
    const CWalletTx* wtx = GetWalletTx(hashTx);
    return wtx && !wtx->isAbandoned() && GetTxDepthInMainChain(*wtx) == 0 && !wtx->InMempool();
}